

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::map_onto<signed_char>
          (Omega_h *this,Read<signed_char> *a_data,LOs *a2b,LO nb,char init_val,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  uint uVar3;
  _Alloc_hider _Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar10;
  uint uVar11;
  uint uVar12;
  Read<signed_char> RVar13;
  string __str;
  Write<signed_char> out;
  string __str_1;
  string local_d8;
  Write<signed_char> local_b8;
  Write<signed_char> local_a0;
  LOs local_90;
  Read<signed_char> local_80;
  Write<signed_char> local_70;
  Read<signed_char> *local_60;
  LOs *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  Write<signed_char>::Write(&local_b8,nb * width,init_val,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (((ulong)local_b8.shared_alloc_.alloc & 1) == 0) {
    iVar6 = (int)(local_b8.shared_alloc_.alloc)->size;
  }
  else {
    iVar6 = (int)((ulong)local_b8.shared_alloc_.alloc >> 3);
  }
  pAVar2 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    iVar7 = (int)pAVar2->size;
  }
  else {
    iVar7 = (int)((ulong)pAVar2 >> 3);
  }
  if (iVar6 < iVar7) {
    if (((ulong)local_b8.shared_alloc_.alloc & 1) == 0) {
      uVar11 = (uint)(local_b8.shared_alloc_.alloc)->size;
    }
    else {
      uVar11 = (uint)((ulong)local_b8.shared_alloc_.alloc >> 3);
    }
    uVar3 = -uVar11;
    if (0 < (int)uVar11) {
      uVar3 = uVar11;
    }
    uVar12 = 1;
    if (9 < uVar3) {
      uVar9 = (ulong)uVar3;
      uVar5 = 4;
      do {
        uVar12 = uVar5;
        uVar8 = (uint)uVar9;
        if (uVar8 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_002ff084;
        }
        if (uVar8 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_002ff084;
        }
        if (uVar8 < 10000) goto LAB_002ff084;
        uVar9 = uVar9 / 10000;
        uVar5 = uVar12 + 4;
      } while (99999 < uVar8);
      uVar12 = uVar12 + 1;
    }
LAB_002ff084:
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_58 = a2b;
    std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar12 - (char)((int)uVar11 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_d8._M_dataplus._M_p + (uVar11 >> 0x1f),uVar12,uVar3);
    _Var4._M_p = local_d8._M_dataplus._M_p;
    pAVar2 = (a_data->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      uVar11 = (uint)pAVar2->size;
    }
    else {
      uVar11 = (uint)((ulong)pAVar2 >> 3);
    }
    uVar3 = -uVar11;
    if (0 < (int)uVar11) {
      uVar3 = uVar11;
    }
    uVar12 = 1;
    if (9 < uVar3) {
      uVar9 = (ulong)uVar3;
      uVar5 = 4;
      do {
        uVar12 = uVar5;
        uVar8 = (uint)uVar9;
        if (uVar8 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_002ff130;
        }
        if (uVar8 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_002ff130;
        }
        if (uVar8 < 10000) goto LAB_002ff130;
        uVar9 = uVar9 / 10000;
        uVar5 = uVar12 + 4;
      } while (99999 < uVar8);
      uVar12 = uVar12 + 1;
    }
LAB_002ff130:
    local_50[0] = local_40;
    local_60 = a_data;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar12 - (char)((int)uVar11 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_50[0]),uVar12,uVar3);
    printf("ERROR: !( %s %s %s ) : ! ( %s %s %s )\n","out.size()",">=","a_data.size()",_Var4._M_p,
           ">=",local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    a2b = local_58;
    a_data = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (((ulong)local_b8.shared_alloc_.alloc & 1) == 0) {
    iVar6 = (int)(local_b8.shared_alloc_.alloc)->size;
  }
  else {
    iVar6 = (int)((ulong)local_b8.shared_alloc_.alloc >> 3);
  }
  local_80.write_.shared_alloc_.alloc = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 1) == 0) {
    iVar7 = (int)(local_80.write_.shared_alloc_.alloc)->size;
  }
  else {
    iVar7 = (int)((ulong)local_80.write_.shared_alloc_.alloc >> 3);
  }
  if (iVar7 <= iVar6) {
    if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
        local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_80.write_.shared_alloc_.alloc =
             (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_80.write_.shared_alloc_.alloc)->use_count =
             (local_80.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_80.write_.shared_alloc_.direct_ptr = (a_data->write_).shared_alloc_.direct_ptr;
    local_90.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
    if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
        local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_90.write_.shared_alloc_.alloc =
             (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_90.write_.shared_alloc_.alloc)->use_count =
             (local_90.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_90.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
    local_70.shared_alloc_.alloc = local_b8.shared_alloc_.alloc;
    if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 &&
        local_b8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70.shared_alloc_.alloc = (Alloc *)((local_b8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b8.shared_alloc_.alloc)->use_count = (local_b8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_70.shared_alloc_.direct_ptr = local_b8.shared_alloc_.direct_ptr;
    map_into<signed_char>(&local_80,&local_90,&local_70,width);
    pAVar2 = local_70.shared_alloc_.alloc;
    if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 &&
        local_70.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_70.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_70.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_90.write_.shared_alloc_.alloc;
    if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
        local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_80.write_.shared_alloc_.alloc;
    if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
        local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    local_a0.shared_alloc_.alloc = local_b8.shared_alloc_.alloc;
    local_a0.shared_alloc_.direct_ptr = local_b8.shared_alloc_.direct_ptr;
    if ((((ulong)local_b8.shared_alloc_.alloc & 7) == 0 &&
         local_b8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_b8.shared_alloc_.alloc)->use_count = (local_b8.shared_alloc_.alloc)->use_count + -1;
      local_a0.shared_alloc_.alloc = (Alloc *)((local_b8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_b8.shared_alloc_.alloc = (Alloc *)0x0;
    local_b8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<signed_char>::Read((Read<signed_char> *)this,&local_a0);
    pAVar2 = local_a0.shared_alloc_.alloc;
    pvVar10 = extraout_RDX;
    if (((ulong)local_a0.shared_alloc_.alloc & 7) == 0 &&
        local_a0.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a0.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a0.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar10 = extraout_RDX_00;
      }
    }
    pAVar2 = local_b8.shared_alloc_.alloc;
    if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 &&
        local_b8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_b8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_b8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar10 = extraout_RDX_01;
      }
    }
    RVar13.write_.shared_alloc_.direct_ptr = pvVar10;
    RVar13.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar13.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","(out.size()) >= (a_data.size())",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x45);
}

Assistant:

Read<T> map_onto(Read<T> a_data, LOs a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  OMEGA_H_CHECK_OP(out.size(), >=, a_data.size());
  map_into(a_data, a2b, out, width);
  return out;
}